

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void threadsafe_mem_leak_operator_delete(void *mem)

{
  MemoryLeakDetector *pMVar1;
  TestMemoryAllocator *allocator;
  MemLeakScopedMutex lock;
  MemLeakScopedMutex MStack_18;
  
  MemLeakScopedMutex::MemLeakScopedMutex(&MStack_18);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  MemoryLeakDetector::invalidateMemory(pMVar1,(char *)mem);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,allocator,mem,false);
  ScopedMutexLock::~ScopedMutexLock(&MStack_18.lock);
  return;
}

Assistant:

static void threadsafe_mem_leak_operator_delete (void* mem) UT_NOTHROW
{
    MemLeakScopedMutex lock;
    MemoryLeakWarningPlugin::getGlobalDetector()->invalidateMemory((char*) mem);
    MemoryLeakWarningPlugin::getGlobalDetector()->deallocMemory(getCurrentNewAllocator(), (char*) mem);
}